

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_instance_t *
wasm_instance_new(wasm_store_t *store,wasm_module_t *module,wasm_extern_t **imports,
                 wasm_trap_t **trap_out)

{
  Trap *pTVar1;
  Module *pMVar2;
  wasm_trap_t *this;
  size_t i;
  ulong uVar3;
  Ptr *in_R9;
  Ptr trap;
  RefVec import_refs;
  Ptr instance;
  RefPtr<wabt::interp::Instance> local_60;
  RefPtr<wabt::interp::Trap> local_48;
  
  fprintf(_stderr,"CAPI: [%s] %p %p\n","wasm_instance_new",store,module);
  if (module == (wasm_module_t *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x2de,
                  "wasm_instance_t *wasm_instance_new(wasm_store_t *, const wasm_module_t *, const wasm_extern_t *const *, wasm_trap_t **)"
                 );
  }
  if (store != (wasm_store_t *)0x0) {
    import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    import_refs.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar3 = 0;
    while( true ) {
      pMVar2 = wasm_ref_t::As<wabt::interp::Module>(&module->super_wasm_ref_t);
      if ((ulong)(((long)(pMVar2->import_types_).
                         super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pMVar2->import_types_).
                        super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar3) break;
      trap.obj_ = (Trap *)(((imports[uVar3]->super_wasm_ref_t).I.obj_)->self_).index;
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      emplace_back<wabt::interp::Ref>(&import_refs,(Ref *)&trap);
      uVar3 = uVar3 + 1;
    }
    trap.root_index_ = 0;
    trap.obj_ = (Trap *)0x0;
    trap.store_ = (Store *)0x0;
    wabt::interp::Instance::Instantiate
              (&instance,(Instance *)store,
               (Store *)(((module->super_wasm_ref_t).I.obj_)->self_).index,(Ref)&import_refs,
               (RefVec *)&trap,in_R9);
    pTVar1 = trap.obj_;
    this = (wasm_trap_t *)operator_new(0x18);
    if (pTVar1 == (Trap *)0x0) {
      wabt::interp::RefPtr<wabt::interp::Instance>::RefPtr(&local_60,&instance);
      wasm_instance_t::wasm_instance_t((wasm_instance_t *)this,&local_60);
      wabt::interp::RefPtr<wabt::interp::Instance>::reset(&local_60);
    }
    else {
      wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr(&local_48,&trap);
      wasm_trap_t::wasm_trap_t(this,&local_48);
      *trap_out = this;
      wabt::interp::RefPtr<wabt::interp::Trap>::reset(&local_48);
      this = (wasm_trap_t *)0x0;
    }
    wabt::interp::RefPtr<wabt::interp::Instance>::reset(&instance);
    wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
    std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
              (&import_refs.
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>);
    return (wasm_instance_t *)this;
  }
  __assert_fail("store",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x2df,
                "wasm_instance_t *wasm_instance_new(wasm_store_t *, const wasm_module_t *, const wasm_extern_t *const *, wasm_trap_t **)"
               );
}

Assistant:

own wasm_instance_t* wasm_instance_new(wasm_store_t* store,
                                       const wasm_module_t* module,
                                       const wasm_extern_t* const imports[],
                                       own wasm_trap_t** trap_out) {
  TRACE("%p %p", store, module);
  assert(module);
  assert(store);

  RefVec import_refs;
  for (size_t i = 0; i < module->As<Module>()->import_types().size(); i++) {
    import_refs.push_back(imports[i]->I->self());
  }

  Trap::Ptr trap;
  auto instance =
      Instance::Instantiate(store->I, module->I->self(), import_refs, &trap);
  if (trap) {
    *trap_out = new wasm_trap_t{trap};
    return nullptr;
  }

  return new wasm_instance_t{instance};
}